

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O1

void __thiscall FTOutline::lineTo(FTOutline *this,VPointF *pt)

{
  short *psVar1;
  short sVar2;
  SW_FT_Vector *pSVar3;
  
  pSVar3 = (this->ft).points;
  sVar2 = (this->ft).n_points;
  pSVar3[sVar2].x = (long)(pt->mx * 64.0);
  pSVar3[sVar2].y = (long)(pt->my * 64.0);
  (this->ft).tags[sVar2] = '\x01';
  psVar1 = &(this->ft).n_points;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void FTOutline::lineTo(const VPointF &pt)
{
    assert(ft.n_points <= SHRT_MAX - 1);

    ft.points[ft.n_points].x = TO_FT_COORD(pt.x());
    ft.points[ft.n_points].y = TO_FT_COORD(pt.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_ON;
    ft.n_points++;
}